

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<signed_char,signed_char>
          (Thread *this,BinopFunc<signed_char,_signed_char> *f)

{
  char cVar1;
  Simd<signed_char,_(unsigned_char)__x10_> SVar2;
  byte local_49;
  undefined1 uStack_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  u8 i;
  SR result;
  Simd<signed_char,_(unsigned_char)__x10_> lhs;
  Simd<signed_char,_(unsigned_char)__x10_> rhs;
  BinopFunc<signed_char,_signed_char> *f_local;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this);
  SVar2 = Pop<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this);
  result.v[8] = SVar2.v[0];
  result.v[9] = SVar2.v[1];
  result.v[10] = SVar2.v[2];
  result.v[0xb] = SVar2.v[3];
  result.v[0xc] = SVar2.v[4];
  result.v[0xd] = SVar2.v[5];
  result.v[0xe] = SVar2.v[6];
  result.v[0xf] = SVar2.v[7];
  lhs.v[0] = SVar2.v[8];
  lhs.v[1] = SVar2.v[9];
  lhs.v[2] = SVar2.v[10];
  lhs.v[3] = SVar2.v[0xb];
  lhs.v[4] = SVar2.v[0xc];
  lhs.v[5] = SVar2.v[0xd];
  lhs.v[6] = SVar2.v[0xe];
  lhs.v[7] = SVar2.v[0xf];
  for (local_49 = 0; local_49 < 0x10; local_49 = local_49 + 1) {
    cVar1 = (*f)(result.v[(ulong)local_49 + 8],lhs.v[(ulong)local_49 + 8]);
    lhs.v[(ulong)local_49 - 0x18] = cVar1;
  }
  SVar2.v[8] = result.v[0];
  SVar2.v[9] = result.v[1];
  SVar2.v[10] = result.v[2];
  SVar2.v[0xb] = result.v[3];
  SVar2.v[0xc] = result.v[4];
  SVar2.v[0xd] = result.v[5];
  SVar2.v[0xe] = result.v[6];
  SVar2.v[0xf] = result.v[7];
  SVar2.v[0] = uStack_48;
  SVar2.v[1] = uStack_47;
  SVar2.v[2] = uStack_46;
  SVar2.v[3] = uStack_45;
  SVar2.v[4] = uStack_44;
  SVar2.v[5] = uStack_43;
  SVar2.v[6] = uStack_42;
  SVar2.v[7] = i;
  Push<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this,SVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}